

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeGetLastLinFlag(void *cvode_mem,long *flag)

{
  long *in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(CVLsMem *)0x120c49);
  if (local_4 == 0) {
    *in_RSI = (long)*(int *)((long)in_stack_ffffffffffffffd8 + 0x138);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetLastLinFlag(void* cvode_mem, long int* flag)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *flag = cvls_mem->last_flag;
  return (CVLS_SUCCESS);
}